

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O1

bool __thiscall
RTIMUSettings::discoverHumidity(RTIMUSettings *this,int *humidityType,uchar *humidityAddress)

{
  bool bVar1;
  char *__s;
  uchar result;
  uchar local_19;
  
  bVar1 = RTIMUHal::HALOpen(&this->super_RTIMUHal);
  if (bVar1) {
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'_','\x0f','\x01',&local_19,"");
    if ((bVar1) && (local_19 == 0xbc)) {
      *humidityType = 2;
      *humidityAddress = '_';
      __s = "Detected HTS221 at standard address";
    }
    else {
      bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'@',0xe7,'\x01',&local_19,"");
      if (!bVar1) goto LAB_00111b5c;
      *humidityType = 3;
      *humidityAddress = '@';
      __s = "Detected HTU21D at standard address";
    }
    puts(__s);
    fflush(_stdout);
    bVar1 = true;
  }
  else {
LAB_00111b5c:
    discoverHumidity();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RTIMUSettings::discoverHumidity(int& humidityType, unsigned char& humidityAddress)
{
    unsigned char result;

    //  auto detect on current bus

    if (HALOpen()) {

        if (HALRead(HTS221_ADDRESS, HTS221_REG_ID, 1, &result, "")) {
            if (result == HTS221_ID) {
                humidityType = RTHUMIDITY_TYPE_HTS221;
                humidityAddress = HTS221_ADDRESS;
                HAL_INFO("Detected HTS221 at standard address\n");
                return true;
            }
        }

        if (HALRead(HTU21D_ADDRESS, HTU21D_READ_USER_REG, 1, &result, "")) {
            humidityType = RTHUMIDITY_TYPE_HTU21D;
            humidityAddress = HTU21D_ADDRESS;
            HAL_INFO("Detected HTU21D at standard address\n");
            return true;
        }

    }
    HAL_ERROR("No humidity sensor detected\n");
    return false;
}